

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void V_CalcCleanFacs(int designwidth,int designheight,int realwidth,int realheight,int *cleanx,
                    int *cleany,int *_cx1,int *_cx2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float aspect;
  int cy2;
  int cx2;
  int cy1;
  int cx1;
  int cheight;
  int cwidth;
  float ratio;
  int *cleany_local;
  int *cleanx_local;
  int realheight_local;
  int realwidth_local;
  int designheight_local;
  int designwidth_local;
  
  aspect = ActiveRatio(realwidth,realheight,(float *)0x0);
  bVar1 = AspectTallerThanWide(aspect);
  if (bVar1) {
    iVar2 = AspectMultiplier(aspect);
    cy1 = (realheight * iVar2) / 0x30;
    cx1 = realwidth;
  }
  else {
    iVar2 = AspectMultiplier(aspect);
    cx1 = (realwidth * iVar2) / 0x30;
    cy1 = realheight;
  }
  iVar3 = MAX<int>(cx1 / designwidth,1);
  iVar4 = MAX<int>(cy1 / designheight,1);
  iVar5 = MAX<int>(realwidth / designwidth,1);
  iVar6 = MAX<int>(realheight / designheight,1);
  iVar2 = iVar3 - iVar4;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  iVar7 = iVar5 - iVar6;
  if (iVar7 < 1) {
    iVar7 = -iVar7;
  }
  if (iVar7 < iVar2) {
    *cleanx = iVar5;
    *cleany = iVar6;
  }
  else {
    *cleanx = iVar3;
    *cleany = iVar4;
  }
  if (*cleanx < *cleany) {
    *cleany = *cleanx;
  }
  else {
    *cleanx = *cleany;
  }
  if (_cx1 != (int *)0x0) {
    *_cx1 = iVar3;
  }
  if (_cx2 != (int *)0x0) {
    *_cx2 = iVar5;
  }
  return;
}

Assistant:

void V_CalcCleanFacs (int designwidth, int designheight, int realwidth, int realheight, int *cleanx, int *cleany, int *_cx1, int *_cx2)
{
	float ratio;
	int cwidth;
	int cheight;
	int cx1, cy1, cx2, cy2;

	ratio = ActiveRatio(realwidth, realheight);
	if (AspectTallerThanWide(ratio))
	{
		cwidth = realwidth;
		cheight = realheight * AspectMultiplier(ratio) / 48;
	}
	else
	{
		cwidth = realwidth * AspectMultiplier(ratio) / 48;
		cheight = realheight;
	}
	// Use whichever pair of cwidth/cheight or width/height that produces less difference
	// between CleanXfac and CleanYfac.
	cx1 = MAX(cwidth / designwidth, 1);
	cy1 = MAX(cheight / designheight, 1);
	cx2 = MAX(realwidth / designwidth, 1);
	cy2 = MAX(realheight / designheight, 1);
	if (abs(cx1 - cy1) <= abs(cx2 - cy2))
	{ // e.g. 640x360 looks better with this.
		*cleanx = cx1;
		*cleany = cy1;
	}
	else
	{ // e.g. 720x480 looks better with this.
		*cleanx = cx2;
		*cleany = cy2;
	}

	if (*cleanx < *cleany)
		*cleany = *cleanx;
	else
		*cleanx = *cleany;

	if (_cx1 != NULL)	*_cx1 = cx1;
	if (_cx2 != NULL)	*_cx2 = cx2;
}